

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::Filter::matches(Filter *this,TestCaseInfo *testCase)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  Pattern *pPVar3;
  undefined8 in_RSI;
  __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
  *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
  local_20;
  undefined8 local_18;
  
  local_18 = in_RSI;
  local_20._M_current =
       (Ptr<Catch::TestSpec::Pattern> *)
       std::
       vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  std::
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return true;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
              ::operator*(&local_20);
    pPVar3 = Ptr<Catch::TestSpec::Pattern>::operator->(this_00);
    uVar2 = (*(pPVar3->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[4])(pPVar3,local_18);
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::TestSpec::Pattern>_*,_std::vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>_>
    ::operator++(&local_20);
  }
  return false;
}

Assistant:

bool matches( TestCaseInfo const& testCase ) const {
                // All patterns in a filter must match for the filter to be a match
                for( std::vector<Ptr<Pattern> >::const_iterator it = m_patterns.begin(), itEnd = m_patterns.end(); it != itEnd; ++it )
                    if( !(*it)->matches( testCase ) )
                        return false;
                    return true;
            }